

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NodeIsMuxType(Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  void **ppvVar4;
  Abc_Obj_t *pNode_00;
  Abc_Obj_t *pNode_01;
  int *piVar5;
  int iVar6;
  uint uVar7;
  
  if (((ulong)pNode & 1) == 0) {
    iVar6 = Abc_AigNodeIsAnd(pNode);
    uVar7 = 0;
    if ((iVar6 != 0) && ((~*(uint *)&pNode->field_0x14 & 0xc00) == 0)) {
      piVar3 = (pNode->vFanins).pArray;
      ppvVar4 = pNode->pNtk->vObjs->pArray;
      pNode_00 = (Abc_Obj_t *)ppvVar4[*piVar3];
      pNode_01 = (Abc_Obj_t *)ppvVar4[piVar3[1]];
      iVar6 = Abc_AigNodeIsAnd(pNode_00);
      uVar7 = 0;
      if (iVar6 != 0) {
        iVar6 = Abc_AigNodeIsAnd(pNode_01);
        if (iVar6 != 0) {
          piVar3 = (pNode_00->vFanins).pArray;
          iVar6 = *piVar3;
          piVar5 = (pNode_01->vFanins).pArray;
          iVar1 = *piVar5;
          uVar7 = 1;
          if ((((iVar6 != iVar1) ||
               (((*(uint *)&pNode_01->field_0x14 ^ *(uint *)&pNode_00->field_0x14) >> 10 & 1) == 0))
              && ((iVar2 = piVar5[1], iVar6 != iVar2 ||
                  (((*(uint *)&pNode_01->field_0x14 >> 0xb ^ *(uint *)&pNode_00->field_0x14 >> 10) &
                   1) == 0)))) &&
             (((iVar6 = piVar3[1], iVar6 != iVar1 ||
               (((*(uint *)&pNode_01->field_0x14 >> 10 ^ *(uint *)&pNode_00->field_0x14 >> 0xb) & 1)
                == 0)) && (uVar7 = 0, iVar6 == iVar2)))) {
            uVar7 = (*(uint *)&pNode_01->field_0x14 ^ *(uint *)&pNode_00->field_0x14) >> 0xb & 1;
          }
        }
      }
    }
    return uVar7;
  }
  __assert_fail("!Abc_ObjIsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                ,0x524,"int Abc_NodeIsMuxType(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeIsMuxType( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Abc_ObjIsComplement(pNode) );
    // if the node is not AND, this is not MUX
    if ( !Abc_AigNodeIsAnd(pNode) )
        return 0;
    // if the children are not complemented, this is not MUX
    if ( !Abc_ObjFaninC0(pNode) || !Abc_ObjFaninC1(pNode) )
        return 0;
    // get children
    pNode0 = Abc_ObjFanin0(pNode);
    pNode1 = Abc_ObjFanin1(pNode);
    // if the children are not ANDs, this is not MUX
    if ( !Abc_AigNodeIsAnd(pNode0) || !Abc_AigNodeIsAnd(pNode1) )
        return 0;
    // otherwise the node is MUX iff it has a pair of equal grandchildren with opposite polarity
    return (Abc_ObjFaninId0(pNode0) == Abc_ObjFaninId0(pNode1) && (Abc_ObjFaninC0(pNode0) ^ Abc_ObjFaninC0(pNode1))) || 
           (Abc_ObjFaninId0(pNode0) == Abc_ObjFaninId1(pNode1) && (Abc_ObjFaninC0(pNode0) ^ Abc_ObjFaninC1(pNode1))) ||
           (Abc_ObjFaninId1(pNode0) == Abc_ObjFaninId0(pNode1) && (Abc_ObjFaninC1(pNode0) ^ Abc_ObjFaninC0(pNode1))) ||
           (Abc_ObjFaninId1(pNode0) == Abc_ObjFaninId1(pNode1) && (Abc_ObjFaninC1(pNode0) ^ Abc_ObjFaninC1(pNode1)));
}